

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_expect_bool(mpack_reader_t *reader)

{
  byte bVar1;
  uint8_t type;
  mpack_reader_t *reader_local;
  
  bVar1 = mpack_expect_type_byte(reader);
  if ((bVar1 & 0xfe) != 0xc2) {
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  return (bVar1 & 1) != 0;
}

Assistant:

bool mpack_expect_bool(mpack_reader_t* reader) {
    uint8_t type = mpack_expect_type_byte(reader);
    if ((type & ~1) != 0xc2)
        mpack_reader_flag_error(reader, mpack_error_type);
    return (bool)(type & 1);
}